

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O1

int ASN1_template_new(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  ulong uVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  
  uVar1 = tt->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 0x300) == 0) {
      if ((uVar1 & 6) == 0) {
        iVar2 = ASN1_item_ex_new(pval,(ASN1_ITEM *)tt->field_name);
        return iVar2;
      }
      pOVar3 = OPENSSL_sk_new_null();
      if (pOVar3 == (OPENSSL_STACK *)0x0) {
        return 0;
      }
      *pval = (ASN1_VALUE *)pOVar3;
    }
    else {
      *pval = (ASN1_VALUE *)0x0;
    }
  }
  else {
    asn1_template_clear((ASN1_VALUE **)pval,(ASN1_TEMPLATE *)tt);
  }
  return 1;
}

Assistant:

static int ASN1_template_new(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  const ASN1_ITEM *it = ASN1_ITEM_ptr(tt->item);
  int ret;
  if (tt->flags & ASN1_TFLG_OPTIONAL) {
    asn1_template_clear(pval, tt);
    return 1;
  }
  // If ANY DEFINED BY nothing to do

  if (tt->flags & ASN1_TFLG_ADB_MASK) {
    *pval = NULL;
    return 1;
  }
  // If SET OF or SEQUENCE OF, its a STACK
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *skval;
    skval = sk_ASN1_VALUE_new_null();
    if (!skval) {
      ret = 0;
      goto done;
    }
    *pval = (ASN1_VALUE *)skval;
    ret = 1;
    goto done;
  }
  // Otherwise pass it back to the item routine
  ret = ASN1_item_ex_new(pval, it);
done:
  return ret;
}